

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O0

int __thiscall
cppcms::applications_pool::mount
          (applications_pool *this,char *__special_file,char *__dir,char *__fstype,ulong __rwflag,
          void *__data)

{
  int extraout_EAX;
  mount_point *in_stack_ffffffffffffffa0;
  char local_50 [16];
  mount_point *in_stack_ffffffffffffffc0;
  char local_28 [20];
  uint local_14;
  char *local_10;
  applications_pool *local_8;
  
  local_14 = (uint)__dir;
  local_10 = __special_file;
  local_8 = this;
  std::shared_ptr<cppcms::application_specific_pool>::shared_ptr
            ((shared_ptr<cppcms::application_specific_pool> *)in_stack_ffffffffffffffa0,
             (shared_ptr<cppcms::application_specific_pool> *)this);
  mount_point::mount_point(in_stack_ffffffffffffffc0);
  mount(this,local_28,local_50,(char *)(ulong)local_14,__rwflag,__data);
  mount_point::~mount_point(in_stack_ffffffffffffffa0);
  std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
            ((shared_ptr<cppcms::application_specific_pool> *)0x3aac6e);
  return extraout_EAX;
}

Assistant:

void applications_pool::mount(booster::shared_ptr<application_specific_pool> gen,int flags)
{
	mount(gen,mount_point(),flags);
}